

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O3

bool Js::AsmJSCompiler::CheckFunctionHead(AsmJsModuleCompiler *m,ParseNode *fn,bool isGlobal)

{
  FncFlags FVar1;
  bool bVar2;
  ParseNodeFnc *pPVar3;
  char16_t *error;
  
  pPVar3 = ParseNode::AsParseNodeFnc(fn);
  FVar1 = pPVar3->fncFlags;
  if ((short)FVar1 < 0) {
    error = L"default, rest & destructuring args not allowed";
  }
  else if ((FVar1 >> 0x18 & 1) == 0) {
    if ((FVar1 >> 0x19 & 1) == 0) {
      if ((FVar1 >> 0x1c & 1) == 0) {
        if ((FVar1 >> 0xd & 1) == 0) {
          if ((isGlobal) || (pPVar3->nestedCount == 0)) {
            if ((FVar1 & (kFunctionIsDefaultModuleExport|kFunctionHasDirectSuper|
                          kFunctionIsDeclaredInParamScope|kFunctionHasDefaultArguments|
                          kFunctionIsGeneratedDefault|kFunctionHasHomeObj|kFunctionIsClassMember|
                          kFunctionIsBaseClassConstructor|kFunctionIsClassConstructor|
                          kFunctionIsMethod|kFunctionHasSuperReference|kFunctionChildCallsEval|
                          kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
                          kFunctionHasDestructuredParams|kFunctionIsAccessor|
                          kFunctionHasHeapArguments|kFunctionUsesArguments|kFunctionCallsEval)) ==
                kFunctionNone) {
              return true;
            }
            error = L"invalid function flags detected";
          }
          else {
            error = L"closure functions are not allowed";
          }
        }
        else {
          error = L"lambda functions are not allowed";
        }
      }
      else {
        error = L"async functions are not allowed";
      }
    }
    else {
      error = L"generator functions are not allowed";
    }
  }
  else {
    error = L"static functions are not allowed";
  }
  bVar2 = AsmJsModuleCompiler::Fail(m,fn,error);
  return bVar2;
}

Assistant:

bool
    AsmJSCompiler::CheckFunctionHead(AsmJsModuleCompiler &m, ParseNode *fn, bool isGlobal /*= true*/)
    {
        ParseNodeFnc * fnc = fn->AsParseNodeFnc();

        if (fnc->HasNonSimpleParameterList())
        {
            return m.Fail(fn, _u("default, rest & destructuring args not allowed"));
        }

        if (fnc->IsStaticMember())
        {
            return m.Fail(fn, _u("static functions are not allowed"));
        }

        if (fnc->IsGenerator())
        {
            return m.Fail(fn, _u("generator functions are not allowed"));
        }

        if (fnc->IsAsync())
        {
            return m.Fail(fn, _u("async functions are not allowed"));
        }

        if (fnc->IsLambda())
        {
            return m.Fail(fn, _u("lambda functions are not allowed"));
        }

        if (!isGlobal && fnc->nestedCount != 0)
        {
            return m.Fail(fn, _u("closure functions are not allowed"));
        }

        if (!fnc->IsAsmJsAllowed())
        {
            return m.Fail(fn, _u("invalid function flags detected"));
        }

        return true;
    }